

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

bool P_ChangePortal(line_t_conflict *ln,int thisid,int destid)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  FLineIdIterator it;
  FLineIdIterator local_28;
  
  if (thisid != 0) {
    local_28.start = tagManager.IDHashFirst[(ulong)(uint)thisid & 0xff];
    local_28.searchtag = thisid;
    uVar2 = FLineIdIterator::Next(&local_28);
    bVar3 = false;
    while (-1 < (int)uVar2) {
      bVar1 = ChangePortalLine(lines + uVar2,destid);
      bVar3 = (bool)(bVar3 | bVar1);
      uVar2 = FLineIdIterator::Next(&local_28);
    }
    return bVar3;
  }
  bVar3 = ChangePortalLine(ln,destid);
  return bVar3;
}

Assistant:

bool P_ChangePortal(line_t *ln, int thisid, int destid)
{
	int lineno;

	if (thisid == 0) return ChangePortalLine(ln, destid);
	FLineIdIterator it(thisid);
	bool res = false;
	while ((lineno = it.Next()) >= 0)
	{
		res |= ChangePortalLine(&lines[lineno], destid);
	}
	return res;
}